

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prompts.c
# Opt level: O0

void free_prompts(prompts_t *p)

{
  prompt_t *ptr;
  prompt_t *pr;
  size_t i;
  prompts_t *p_local;
  
  if (p->ldisc_ptr_to_us != (prompts_t **)0x0) {
    *p->ldisc_ptr_to_us = (prompts_t *)0x0;
  }
  for (pr = (prompt_t *)0x0; pr < (prompt_t *)p->n_prompts; pr = (prompt_t *)((long)&pr->prompt + 1)
      ) {
    ptr = p->prompts[(long)pr];
    strbuf_free(ptr->result);
    safefree(ptr->prompt);
    safefree(ptr);
  }
  safefree(p->prompts);
  safefree(p->name);
  safefree(p->instruction);
  safefree(p);
  return;
}

Assistant:

void free_prompts(prompts_t *p)
{
    size_t i;

    /* If an Ldisc currently knows about us, tell it to forget us, so
     * it won't dereference a stale pointer later. */
    if (p->ldisc_ptr_to_us)
        *p->ldisc_ptr_to_us = NULL;

    for (i=0; i < p->n_prompts; i++) {
        prompt_t *pr = p->prompts[i];
        strbuf_free(pr->result);
        sfree(pr->prompt);
        sfree(pr);
    }
    sfree(p->prompts);
    sfree(p->name);
    sfree(p->instruction);
    sfree(p);
}